

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_string_n.hpp
# Opt level: O0

void __thiscall dna_string_n::build_rank_support(dna_string_n *this)

{
  p_rank_n r;
  p_rank_n r_00;
  ulong uVar1;
  ulong uVar2;
  reference pvVar3;
  dna_string_n *in_RDI;
  uint64_t block_number;
  uint64_t superblock_number;
  p_rank_n local_rank;
  uint64_t block_number_1;
  uint64_t superblock_number_1;
  uint64_t bl;
  p_rank_n block_r;
  p_rank_n superblock_r;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  uint64_t local_178;
  undefined1 local_170 [40];
  ulong local_148;
  ulong local_140;
  uint64_t in_stack_fffffffffffffec8;
  uint64_t in_stack_fffffffffffffed0;
  uint64_t in_stack_fffffffffffffed8;
  dna_string_n *in_stack_fffffffffffffee0;
  p_rank_n local_110;
  p_rank_n local_e8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  uint64_t local_a0;
  undefined1 local_98 [40];
  ulong local_70;
  ulong local_68;
  ulong local_60;
  p_rank_n local_58;
  p_rank_n local_30;
  
  memset(&local_30,0,0x28);
  memset(&local_58,0,0x28);
  for (local_60 = 0; local_60 < in_RDI->n_blocks - 1; local_60 = local_60 + 1) {
    local_68 = local_60 >> 0x19;
    local_70 = local_60 & 0x1ffffff;
    if (local_70 == 0) {
      pvVar3 = std::vector<p_rank_n,_std::allocator<p_rank_n>_>::operator[]
                         (&in_RDI->superblock_ranks,local_68);
      memcpy(pvVar3,&local_30,0x28);
      memset(local_98,0,0x28);
      memcpy(&local_58,local_98,0x28);
    }
    uVar2 = local_68;
    uVar1 = local_70;
    memcpy(&local_c0,&local_58,0x28);
    r.C = uStack_b8;
    r.A = local_c0;
    r.G = local_b0;
    r.N = uStack_a8;
    r.T = local_a0;
    set_counters(in_RDI,uVar2,uVar1,r);
    block_rank(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8);
    p_rank_n::operator+(&local_110,&local_58,&local_e8);
    memcpy(&local_58,&local_110,0x28);
    p_rank_n::operator+((p_rank_n *)&stack0xfffffffffffffec8,&local_30,&local_e8);
    memcpy(&local_30,&stack0xfffffffffffffec8,0x28);
  }
  local_140 = in_RDI->n_blocks - 1 >> 0x19;
  local_148 = in_RDI->n_blocks - 1 & 0x1ffffff;
  if (local_148 == 0) {
    pvVar3 = std::vector<p_rank_n,_std::allocator<p_rank_n>_>::operator[]
                       (&in_RDI->superblock_ranks,local_140);
    memcpy(pvVar3,&local_30,0x28);
    memset(local_170,0,0x28);
    memcpy(&local_58,local_170,0x28);
  }
  uVar2 = local_140;
  uVar1 = local_148;
  memcpy(&local_198,&local_58,0x28);
  r_00.C = uStack_190;
  r_00.A = local_198;
  r_00.G = local_188;
  r_00.N = uStack_180;
  r_00.T = local_178;
  set_counters(in_RDI,uVar2,uVar1,r_00);
  return;
}

Assistant:

void build_rank_support(){

		p_rank_n superblock_r = {};
		p_rank_n block_r = {};

		for(uint64_t bl = 0; bl < n_blocks-1; ++bl){

			uint64_t superblock_number = bl/BLOCKS_PER_SUPERBLOCK_N;
			uint64_t block_number = bl%BLOCKS_PER_SUPERBLOCK_N;

			if(block_number == 0){

				superblock_ranks[superblock_number]=superblock_r;
				block_r = {};

			}

			set_counters(superblock_number, block_number,block_r);

			p_rank_n local_rank = block_rank(superblock_number, block_number);

			block_r = block_r + local_rank;
			superblock_r = superblock_r + local_rank;

		}

		uint64_t superblock_number = (n_blocks-1)/BLOCKS_PER_SUPERBLOCK_N;
		uint64_t block_number = (n_blocks-1)%BLOCKS_PER_SUPERBLOCK_N;

		if(block_number == 0){

			superblock_ranks[superblock_number]=superblock_r;
			block_r = {};

		}

		set_counters(superblock_number, block_number,block_r);

	}